

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_callmsg.c
# Opt level: O3

_Bool xdr_call_encode(XDR *xdrs,rpc_msg *cmsg)

{
  uint uVar1;
  uint uVar2;
  msg_type mVar3;
  _Bool _Var4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  char *pcVar10;
  uint *puVar11;
  
  uVar1 = (cmsg->cb_cred).oa_length;
  if (uVar1 < 0x191) {
    uVar2 = (cmsg->cb_verf).oa_length;
    if (400 < uVar2) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      pcVar10 = "%s:%u ERROR cb_verf.oa_length (%u) > %u";
      uVar9 = 0x49;
LAB_001115c5:
      (*__ntirpc_pkg_params.warnx_)(pcVar10,"xdr_call_encode",uVar9,(ulong)uVar2,400);
      return false;
    }
    puVar11 = (uint *)xdrs->x_data;
    puVar7 = (uint *)(xdrs->x_v).vio_wrap;
    puVar5 = (uint *)((long)puVar11 + (ulong)((uVar2 + 3 & 0x3fc) + (uVar1 + 3 & 0x3fc)) + 0x28);
    puVar6 = puVar11;
    if (puVar5 <= puVar7) {
      xdrs->x_data = (uint8_t *)puVar5;
      if ((xdrs->x_v).vio_tail < puVar5) {
        (xdrs->x_v).vio_tail = (uint8_t *)puVar5;
        *(uint **)((long)xdrs->x_base + 0x10) = puVar5;
      }
      puVar6 = puVar5;
      if (puVar11 != (uint *)0x0) {
        if ((__ntirpc_pkg_params.debug_flags._3_1_ & 2) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_call_encode",0x55);
        }
        uVar1 = cmsg->rm_xid;
        *puVar11 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        mVar3 = cmsg->rm_direction;
        puVar11[1] = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18
        ;
        uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
        puVar11[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
        ;
        uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
        if (uVar1 != 2) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR rm_call.cb_rpcvers %u != %u","xdr_call_encode",0x5c,(ulong)uVar1,2
                    );
          return false;
        }
        uVar1 = cmsg->cb_prog;
        puVar11[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
        ;
        uVar1 = cmsg->cb_vers;
        puVar11[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
        ;
        uVar1 = cmsg->cb_proc;
        puVar11[5] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
        ;
        uVar1 = (cmsg->cb_cred).oa_flavor;
        puVar11[6] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
        ;
        uVar1 = (cmsg->cb_cred).oa_length;
        puVar11[7] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
        ;
        puVar11 = puVar11 + 8;
        uVar8 = (ulong)(cmsg->cb_cred).oa_length;
        if (uVar8 != 0) {
          memcpy(puVar11,(cmsg->cb_cred).oa_body,uVar8);
          puVar11 = (uint *)((long)puVar11 + (ulong)((cmsg->cb_cred).oa_length + 3 & 0xfffffffc));
        }
        uVar1 = (cmsg->cb_verf).oa_flavor;
        *puVar11 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar1 = (cmsg->cb_verf).oa_length;
        puVar11[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
        ;
        uVar8 = (ulong)(cmsg->cb_verf).oa_length;
        if (uVar8 != 0) {
          memcpy(puVar11 + 2,(cmsg->cb_verf).oa_body,uVar8);
          return true;
        }
        return true;
      }
    }
    if ((__ntirpc_pkg_params.debug_flags._3_1_ & 2) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_call_encode",0x78);
      puVar6 = (uint *)xdrs->x_data;
      puVar7 = (uint *)(xdrs->x_v).vio_wrap;
    }
    uVar1 = cmsg->rm_xid;
    puVar11 = puVar6 + 1;
    if (puVar7 < puVar11) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
      if (!_Var4) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)cmsg->rm_xid;
        pcVar10 = "%s:%u ERROR rm_xid %u";
        uVar9 = 0x7c;
        goto LAB_00111a0b;
      }
      puVar11 = (uint *)xdrs->x_data;
      puVar7 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar6 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)puVar11;
    }
    mVar3 = cmsg->rm_direction;
    puVar6 = puVar11 + 1;
    if (puVar7 < puVar6) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,mVar3);
      if (!_Var4) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)cmsg->rm_direction;
        pcVar10 = "%s:%u ERROR rm_direction %u";
        uVar9 = 0x83;
        goto LAB_00111a0b;
      }
      puVar6 = (uint *)xdrs->x_data;
      puVar7 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar11 = mVar3 >> 0x18 | (mVar3 & 0xff0000) >> 8 | (mVar3 & 0xff00) << 8 | mVar3 << 0x18;
      xdrs->x_data = (uint8_t *)puVar6;
    }
    uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
    if (puVar7 < puVar6 + 1) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
      if (!_Var4) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)(cmsg->ru).RM_cmb.cb_rpcvers;
        pcVar10 = "%s:%u ERROR rm_call.cb_rpcvers %u";
        uVar9 = 0x8a;
        goto LAB_00111a0b;
      }
    }
    else {
      *puVar6 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)(puVar6 + 1);
    }
    uVar1 = (cmsg->ru).RM_cmb.cb_rpcvers;
    if (uVar1 != 2) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR rm_call.cb_rpcvers %u != %u","xdr_call_encode",0x91,(ulong)uVar1,2);
      return false;
    }
    uVar1 = cmsg->cb_prog;
    puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    puVar11 = (uint *)((long)xdrs->x_data + 4);
    if (puVar6 < puVar11) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
      if (!_Var4) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)cmsg->cb_prog;
        pcVar10 = "%s:%u ERROR cb_prog %u";
        uVar9 = 0x99;
        goto LAB_00111a0b;
      }
      puVar11 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *(uint *)xdrs->x_data =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)puVar11;
    }
    uVar1 = cmsg->cb_vers;
    puVar7 = puVar11 + 1;
    if (puVar6 < puVar7) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
      if (!_Var4) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)cmsg->cb_vers;
        pcVar10 = "%s:%u ERROR cb_vers %u";
        uVar9 = 0xa0;
        goto LAB_00111a0b;
      }
      puVar7 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
    }
    else {
      *puVar11 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)puVar7;
    }
    uVar1 = cmsg->cb_proc;
    if (puVar6 < puVar7 + 1) {
      _Var4 = (*xdrs->x_ops->x_putunit)(xdrs,uVar1);
      if (!_Var4) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        uVar8 = (ulong)cmsg->cb_proc;
        pcVar10 = "%s:%u ERROR cb_proc %u";
        uVar9 = 0xa7;
LAB_00111a0b:
        (*__ntirpc_pkg_params.warnx_)(pcVar10,"xdr_call_encode",uVar9,uVar8);
        return false;
      }
    }
    else {
      *puVar7 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      xdrs->x_data = (uint8_t *)(puVar7 + 1);
    }
    _Var4 = xdr_opaque_auth_encode(xdrs,&cmsg->cb_cred);
    if (_Var4) {
      _Var4 = xdr_opaque_auth_encode(xdrs,&cmsg->cb_verf);
      if (_Var4) {
        return true;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
        uVar9 = 0xb4;
LAB_001119db:
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR (return)","xdr_call_encode",uVar9);
        return false;
      }
    }
    else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      uVar9 = 0xae;
      goto LAB_001119db;
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    pcVar10 = "%s:%u ERROR cb_cred.oa_length (%u) > %u";
    uVar9 = 0x41;
    uVar2 = uVar1;
    goto LAB_001115c5;
  }
  return false;
}

Assistant:

bool
xdr_call_encode(XDR *xdrs, struct rpc_msg *cmsg)
{
	struct opaque_auth *oa;
	int32_t *buf;

	if (cmsg->cb_cred.oa_length > MAX_AUTH_BYTES) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_cred.oa_length (%u) > %u",
			__func__, __LINE__,
			cmsg->cb_cred.oa_length,
			MAX_AUTH_BYTES);
		return (false);
	}
	if (cmsg->cb_verf.oa_length > MAX_AUTH_BYTES) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR cb_verf.oa_length (%u) > %u",
			__func__, __LINE__,
			cmsg->cb_verf.oa_length,
			MAX_AUTH_BYTES);
		return (false);
	}
	buf = xdr_inline_encode(xdrs, 8 * BYTES_PER_XDR_UNIT
					+ RNDUP(cmsg->cb_cred.oa_length)
					+ 2 * BYTES_PER_XDR_UNIT
					+ RNDUP(cmsg->cb_verf.oa_length));
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		IXDR_PUT_INT32(buf, cmsg->rm_xid);
		IXDR_PUT_ENUM(buf, cmsg->rm_direction);
		IXDR_PUT_INT32(buf, cmsg->rm_call.cb_rpcvers);
		if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers,
				RPC_MSG_VERSION);
			return (false);
		}
		IXDR_PUT_INT32(buf, cmsg->cb_prog);
		IXDR_PUT_INT32(buf, cmsg->cb_vers);
		IXDR_PUT_INT32(buf, cmsg->cb_proc);
		oa = &cmsg->cb_cred;
		IXDR_PUT_ENUM(buf, oa->oa_flavor);
		IXDR_PUT_INT32(buf, oa->oa_length);
		if (oa->oa_length) {
			memcpy(buf, oa->oa_body, oa->oa_length);
			buf += RNDUP(oa->oa_length) / sizeof (int32_t);
		}
		oa = &cmsg->cb_verf;
		IXDR_PUT_ENUM(buf, oa->oa_flavor);
		IXDR_PUT_INT32(buf, oa->oa_length);
		if (oa->oa_length) {
			memcpy(buf, oa->oa_body, oa->oa_length);
			/* no real need....
			buf += RNDUP(oa->oa_length) / sizeof (int32_t);
			*/
		}
	} else {
		/* nTI-RPC handles multiple buffers */
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_putuint32(xdrs, cmsg->rm_xid)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_xid %u",
				__func__, __LINE__,
				cmsg->rm_xid);
			return (false);
		}
		if (!xdr_putenum(xdrs, cmsg->rm_direction)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_direction %u",
				__func__, __LINE__,
				cmsg->rm_direction);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->rm_call.cb_rpcvers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers);
			return (false);
		}
		if (cmsg->rm_call.cb_rpcvers != RPC_MSG_VERSION) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_call.cb_rpcvers %u != %u",
				__func__, __LINE__,
				cmsg->rm_call.cb_rpcvers,
				RPC_MSG_VERSION);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_prog)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_prog %u",
				__func__, __LINE__,
				cmsg->cb_prog);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_vers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_vers %u",
				__func__, __LINE__,
				cmsg->cb_vers);
			return (false);
		}
		if (!xdr_putuint32(xdrs, cmsg->cb_proc)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR cb_proc %u",
				__func__, __LINE__,
				cmsg->cb_proc);
			return (false);
		}
		if (!xdr_opaque_auth_encode(xdrs, &(cmsg->cb_cred))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_opaque_auth_encode(xdrs, &(cmsg->cb_verf))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}
	}
	return (true);
}